

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

char * canonical_charset_name(char *charset)

{
  int iVar1;
  size_t sVar2;
  char *in_RDI;
  char c;
  char *s;
  char *p;
  char cs [16];
  char local_39;
  char *local_38;
  char *local_30;
  char local_28 [24];
  char *local_10;
  
  local_10 = in_RDI;
  if (((in_RDI == (char *)0x0) || (*in_RDI == '\0')) || (sVar2 = strlen(in_RDI), 0xf < sVar2)) {
    return local_10;
  }
  local_38 = local_10;
  local_30 = local_28;
  while (*local_38 != '\0') {
    local_39 = *local_38;
    if (('`' < local_39) && (local_39 < '{')) {
      local_39 = local_39 + -0x20;
    }
    *local_30 = local_39;
    local_38 = local_38 + 1;
    local_30 = local_30 + 1;
  }
  *local_30 = '\0';
  iVar1 = strcmp(local_28,"UTF-8");
  if ((iVar1 != 0) && (iVar1 = strcmp(local_28,"UTF8"), iVar1 != 0)) {
    iVar1 = strcmp(local_28,"UTF-16BE");
    if ((iVar1 != 0) && (iVar1 = strcmp(local_28,"UTF16BE"), iVar1 != 0)) {
      iVar1 = strcmp(local_28,"UTF-16LE");
      if ((iVar1 != 0) && (iVar1 = strcmp(local_28,"UTF16LE"), iVar1 != 0)) {
        iVar1 = strcmp(local_28,"CP932");
        if (iVar1 == 0) {
          return "CP932";
        }
        return local_10;
      }
      return "UTF-16LE";
    }
    return "UTF-16BE";
  }
  return "UTF-8";
}

Assistant:

static const char *
canonical_charset_name(const char *charset)
{
	char cs[16];
	char *p;
	const char *s;

	if (charset == NULL || charset[0] == '\0'
	    || strlen(charset) > 15)
		return (charset);

	/* Copy name to uppercase. */
	p = cs;
	s = charset;
	while (*s) {
		char c = *s++;
		if (c >= 'a' && c <= 'z')
			c -= 'a' - 'A';
		*p++ = c;
	}
	*p++ = '\0';

	if (strcmp(cs, "UTF-8") == 0 ||
	    strcmp(cs, "UTF8") == 0)
		return ("UTF-8");
	if (strcmp(cs, "UTF-16BE") == 0 ||
	    strcmp(cs, "UTF16BE") == 0)
		return ("UTF-16BE");
	if (strcmp(cs, "UTF-16LE") == 0 ||
	    strcmp(cs, "UTF16LE") == 0)
		return ("UTF-16LE");
	if (strcmp(cs, "CP932") == 0)
		return ("CP932");
	return (charset);
}